

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O0

HTMLElement * __thiscall choc::html::HTMLElement::addLink(HTMLElement *this,string_view linkURL)

{
  string_view value;
  HTMLElement *pHVar1;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  HTMLElement *local_20;
  HTMLElement *this_local;
  string_view linkURL_local;
  
  linkURL_local._M_len = (size_t)linkURL._M_str;
  this_local = (HTMLElement *)linkURL._M_len;
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"a",&local_41);
  pHVar1 = addChild(this,&local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"href",&local_79);
  value._M_str = (char *)linkURL_local._M_len;
  value._M_len = (size_t)this_local;
  pHVar1 = setProperty(pHVar1,&local_78,value);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return pHVar1;
}

Assistant:

HTMLElement& addLink (std::string_view linkURL)     { return addChild ("a").setProperty ("href", linkURL); }